

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<QCss::AnimationRule::AnimationRuleSet>::copyAppend
          (QGenericArrayOps<QCss::AnimationRule::AnimationRuleSet> *this,AnimationRuleSet *b,
          AnimationRuleSet *e)

{
  AnimationRuleSet *this_00;
  ulong in_RDX;
  ulong in_RSI;
  AnimationRuleSet *in_RDI;
  AnimationRuleSet *data;
  ulong local_10;
  
  if (in_RSI != in_RDX) {
    this_00 = QArrayDataPointer<QCss::AnimationRule::AnimationRuleSet>::begin
                        ((QArrayDataPointer<QCss::AnimationRule::AnimationRuleSet> *)0xa56ee7);
    local_10 = in_RSI;
    while (local_10 < in_RDX) {
      QCss::AnimationRule::AnimationRuleSet::AnimationRuleSet(this_00,in_RDI);
      local_10 = local_10 + 0x20;
      (in_RDI->declarations).d.ptr =
           (Declaration *)((long)&(((in_RDI->declarations).d.ptr)->d).d.ptr + 1);
    }
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }